

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O0

Gia_Man_t * Gia_ManReadMiniLut(char *pFileName)

{
  Mini_Lut_t *p_00;
  Gia_Man_t *pGVar1;
  char *pcVar2;
  Gia_Man_t *pGia;
  Mini_Lut_t *p;
  char *pFileName_local;
  
  p_00 = Mini_LutLoad(pFileName);
  pGVar1 = Gia_ManFromMiniLut(p_00,(Vec_Int_t **)0x0);
  if (pGVar1->pName != (char *)0x0) {
    free(pGVar1->pName);
    pGVar1->pName = (char *)0x0;
  }
  pcVar2 = Extra_FileNameGeneric(pFileName);
  pGVar1->pName = pcVar2;
  Mini_LutStop(p_00);
  return pGVar1;
}

Assistant:

Gia_Man_t * Gia_ManReadMiniLut( char * pFileName )
{
    Mini_Lut_t * p = Mini_LutLoad( pFileName );
    Gia_Man_t * pGia = Gia_ManFromMiniLut( p, NULL );
    ABC_FREE( pGia->pName );
    pGia->pName = Extra_FileNameGeneric( pFileName ); 
    Mini_LutStop( p );
    return pGia;
}